

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsHessian_ASA_FSA.c
# Opt level: O1

int fQS(int Ns,sunrealtype t,N_Vector y,N_Vector *yS,N_Vector yQdot,N_Vector *yQSdot,void *user_data
       ,N_Vector tmp,N_Vector tmpQ)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  
  pdVar4 = *(double **)((long)y->content + 0x10);
  dVar1 = *pdVar4;
  dVar2 = pdVar4[1];
  dVar3 = pdVar4[2];
  pdVar4 = *(double **)((long)(*yS)->content + 0x10);
  **(double **)((long)(*yQSdot)->content + 0x10) =
       pdVar4[2] * dVar3 + *pdVar4 * dVar1 + pdVar4[1] * dVar2;
  pdVar4 = *(double **)((long)yS[1]->content + 0x10);
  **(double **)((long)yQSdot[1]->content + 0x10) =
       dVar3 * pdVar4[2] + dVar1 * *pdVar4 + dVar2 * pdVar4[1];
  return 0;
}

Assistant:

static int fQS(int Ns, sunrealtype t, N_Vector y, N_Vector* yS, N_Vector yQdot,
               N_Vector* yQSdot, void* user_data, N_Vector tmp, N_Vector tmpQ)
{
  sunrealtype y1, y2, y3;
  sunrealtype s1, s2, s3;

  y1 = Ith(y, 1);
  y2 = Ith(y, 2);
  y3 = Ith(y, 3);

  /* 1st sensitivity RHS */

  s1 = Ith(yS[0], 1);
  s2 = Ith(yS[0], 2);
  s3 = Ith(yS[0], 3);

  Ith(yQSdot[0], 1) = y1 * s1 + y2 * s2 + y3 * s3;

  /* 1st sensitivity RHS */

  s1 = Ith(yS[1], 1);
  s2 = Ith(yS[1], 2);
  s3 = Ith(yS[1], 3);

  Ith(yQSdot[1], 1) = y1 * s1 + y2 * s2 + y3 * s3;

  return (0);
}